

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * monster_test_global_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *mark;
  uint64_t uStack_60;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x4d7947616d652e45) {
    if (uVar1 != 0x46616e746173792e) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 8,end);
    if (0x52656f7264657264 < uVar1) {
      if (uVar1 != 0x52656f7264657265) {
        return buf;
      }
      pcVar2 = buf + 0x10;
      uVar1 = flatcc_json_parser_symbol_part(pcVar2,end);
      if (uVar1 >> 0x18 != 0x64456e756d) {
        if ((long)end - (long)pcVar2 < 7 || uVar1 >> 0x10 != 0x64436f6c6f72) {
          return buf;
        }
        if (buf[0x16] != '.') {
          return buf;
        }
        pcVar2 = Fantasy_ReorderedColor_parse_json_enum
                           (ctx,buf + 0x17,end,value_type,value,aggregate);
        return pcVar2;
      }
      if ((long)end - (long)pcVar2 < 6) {
        return buf;
      }
      if (buf[0x15] != '.') {
        return buf;
      }
      pcVar2 = Fantasy_ReorderedEnum_parse_json_enum(ctx,buf + 0x16,end,value_type,value,aggregate);
      return pcVar2;
    }
    if (uVar1 != 0x4368617261637465) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
    if ((long)end - (long)(buf + 0x10) < 2) {
      return buf;
    }
    if ((uVar1 & 0xff00000000000000) != 0x7200000000000000) {
      return buf;
    }
    if (buf[0x11] != '.') {
      return buf;
    }
    pcVar2 = Fantasy_Character_parse_json_enum(ctx,buf + 0x12,end,value_type,value,aggregate);
    return pcVar2;
  }
  if (uVar1 == 0x4d7947616d652e4f) {
    uVar1 = flatcc_json_parser_symbol_part(buf + 8,end);
    if (uVar1 != 0x746865724e616d65) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
    if (uVar1 != 0x53706163652e4672) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 0x18,end);
    if (uVar1 != 0x6f6d496e636c7564) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 0x20,end);
    if (1 < (long)end - (long)(buf + 0x20)) {
      if ((uVar1 & 0xff00000000000000) != 0x6500000000000000) {
        return buf;
      }
      if (buf[0x21] != '.') {
        return buf;
      }
      pcVar2 = buf + 0x22;
      uVar1 = flatcc_json_parser_symbol_part(pcVar2,end);
      if ((uint)(uVar1 >> 0x28) == 0x466f6f) {
        pcVar3 = flatcc_json_parser_match_constant(ctx,pcVar2,end,3,aggregate);
        if (pcVar3 == pcVar2) {
          return pcVar2;
        }
        uVar1 = 0x11;
      }
      else {
        if (uVar1 != 0x496e636c75646556) {
          return pcVar2;
        }
        pcVar4 = buf + 0x2a;
        uVar1 = flatcc_json_parser_symbol_part(pcVar4,end);
        if ((short)(uVar1 >> 0x30) != 0x616c) {
          return pcVar2;
        }
        pcVar3 = flatcc_json_parser_match_constant(ctx,pcVar4,end,2,aggregate);
        if (pcVar3 == pcVar4) {
          return pcVar2;
        }
        uVar1 = 0;
      }
      *value = uVar1;
      *value_type = 0;
      return pcVar3;
    }
    return buf;
  }
  if (uVar1 != 0x4d7947616d652e45) {
    return buf;
  }
  uVar1 = flatcc_json_parser_symbol_part(buf + 8,end);
  if (0x78616d706c652e68 < uVar1) {
    if (uVar1 < 0x78616d706c652e6e) {
      if (uVar1 != 0x78616d706c652e69) {
        return buf;
      }
      uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
      if ((long)end - (long)(buf + 0x10) < 8) {
        return buf;
      }
      if ((uVar1 & 0xffffffffffffff00) != 0x6e745f656e756d00) {
        return buf;
      }
      if (buf[0x17] != '.') {
        return buf;
      }
      pcVar2 = MyGame_Example_int_enum_parse_json_enum
                         (ctx,buf + 0x18,end,value_type,value,aggregate);
      return pcVar2;
    }
    if (0x78616d706c65322d < uVar1) {
      if (uVar1 != 0x78616d706c65322e) {
        return buf;
      }
      uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
      if (uVar1 == 0x5375625379737465) {
        uVar1 = flatcc_json_parser_symbol_part(buf + 0x18,end);
        if (uVar1 != 0x6d2e537562537973) {
          return buf;
        }
        uVar1 = flatcc_json_parser_symbol_part(buf + 0x20,end);
        if (((uVar1 & 0xffffffff00000000) != 0x74656d4100000000) &&
           ((uVar1 & 0xffffffff00000000) != 0x74656d4200000000)) {
          return buf;
        }
        if ((long)end - (long)(buf + 0x20) < 5) {
          return buf;
        }
        if (buf[0x24] != '.') {
          return buf;
        }
        pcVar2 = buf + 0x25;
        uVar1 = flatcc_json_parser_symbol_part(pcVar2,end);
        if (uVar1 >> 8 == 0x537472616e6765) {
          pcVar4 = flatcc_json_parser_match_constant(ctx,pcVar2,end,7,aggregate);
          if (pcVar4 == pcVar2) {
            return pcVar2;
          }
          uVar1 = 1;
        }
        else {
          if ((uVar1 & 0xffffffff00000000) != 0x4e4f4e4500000000) {
            return pcVar2;
          }
          pcVar4 = flatcc_json_parser_match_constant(ctx,pcVar2,end,4,aggregate);
          if (pcVar4 == pcVar2) {
            return pcVar2;
          }
          uVar1 = 0;
        }
        *value = uVar1;
      }
      else {
        if ((long)end - (long)(buf + 0x10) < 4 || (uint)(uVar1 >> 0x28) != 0x666f6f) {
          return buf;
        }
        if (buf[0x13] != '.') {
          return buf;
        }
        pcVar2 = buf + 0x14;
        uVar1 = flatcc_json_parser_symbol_part(pcVar2,end);
        if ((uint)(uVar1 >> 0x3b) < 0xf) {
          if ((uVar1 & 0x7fffffffff000000) != 0x7461626c65000000) {
            return pcVar2;
          }
          pcVar4 = flatcc_json_parser_match_constant(ctx,pcVar2,end,5,aggregate);
          if (pcVar4 == pcVar2) {
            return pcVar2;
          }
          uStack_60 = 2;
        }
        else if ((uVar1 & 0xff00000000000000) == 0x7800000000000000) {
          pcVar4 = flatcc_json_parser_match_constant(ctx,pcVar2,end,1,aggregate);
          if (pcVar4 == pcVar2) {
            return pcVar2;
          }
          uStack_60 = 0;
        }
        else {
          if ((uVar1 & 0xff00000000000000) != 0x7900000000000000) {
            return pcVar2;
          }
          pcVar4 = flatcc_json_parser_match_constant(ctx,pcVar2,end,1,aggregate);
          if (pcVar4 == pcVar2) {
            return pcVar2;
          }
          uStack_60 = 1;
        }
        *value = uStack_60;
      }
      *value_type = 0;
      return pcVar4;
    }
    if (uVar1 != 0x78616d706c652e6e) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
    if (uVar1 >> 8 == 0x65675f656e756d) {
      if ((long)end - (long)(buf + 0x10) < 8) {
        return buf;
      }
      if (buf[0x17] != '.') {
        return buf;
      }
      pcVar2 = MyGame_Example_neg_enum_parse_json_enum
                         (ctx,buf + 0x18,end,value_type,value,aggregate);
      return pcVar2;
    }
    if (uVar1 != 0x6f74656d70747965) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 0x18,end);
    if ((long)end - (long)(buf + 0x18) < 4) {
      return buf;
    }
    if ((uVar1 & 0xffffff0000000000) != 0x6e756d0000000000) {
      return buf;
    }
    if (buf[0x1b] != '.') {
      return buf;
    }
    pcVar2 = MyGame_Example_notemptyenum_parse_json_enum
                       (ctx,buf + 0x1c,end,value_type,value,aggregate);
    return pcVar2;
  }
  if (uVar1 < 0x78616d706c652e43) {
    if (uVar1 != 0x78616d706c652e41) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
    if ((long)end - (long)(buf + 0x10) < 3) {
      return buf;
    }
    if ((uVar1 & 0xffff000000000000) != 0x6e79000000000000) {
      return buf;
    }
    if (buf[0x12] != '.') {
      return buf;
    }
    pcVar2 = MyGame_Example_Any_parse_json_enum(ctx,buf + 0x13,end,value_type,value,aggregate);
    return pcVar2;
  }
  if (0x78616d706c652e45 < uVar1) {
    if (uVar1 == 0x78616d706c652e68) {
      uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
      if ((long)end - (long)(buf + 0x10) < 8) {
        return buf;
      }
      if ((uVar1 & 0xffffffffffffff00) != 0x65785f656e756d00) {
        return buf;
      }
      if (buf[0x17] != '.') {
        return buf;
      }
      pcVar2 = MyGame_Example_hex_enum_parse_json_enum
                         (ctx,buf + 0x18,end,value_type,value,aggregate);
      return pcVar2;
    }
    if (uVar1 != 0x78616d706c652e46) {
      return buf;
    }
    uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
    if ((long)end - (long)(buf + 0x10) < 3) {
      return buf;
    }
    if ((uVar1 & 0xffff000000000000) != 0x6f6f000000000000) {
      return buf;
    }
    if (buf[0x12] != '.') {
      return buf;
    }
    pcVar2 = MyGame_Example_Foo_parse_json_enum(ctx,buf + 0x13,end,value_type,value,aggregate);
    return pcVar2;
  }
  if (uVar1 != 0x78616d706c652e43) {
    return buf;
  }
  uVar1 = flatcc_json_parser_symbol_part(buf + 0x10,end);
  if ((long)end - (long)(buf + 0x10) < 5) {
    return buf;
  }
  if ((uVar1 & 0xffffffff00000000) != 0x6f6c6f7200000000) {
    return buf;
  }
  if (buf[0x14] != '.') {
    return buf;
  }
  pcVar2 = MyGame_Example_Color_parse_json_enum(ctx,buf + 0x15,end,value_type,value,aggregate);
  return pcVar2;
}

Assistant:

static const char *monster_test_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x4d7947616d652e45) { /* branch "MyGame.E" */
        if (w == 0x46616e746173792e) { /* descend "Fantasy." */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w < 0x52656f7264657265) { /* branch "Reordere" */
                if (w == 0x4368617261637465) { /* descend "Characte" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xff00000000000000) == 0x7200000000000000) { /* "r" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 1);
                        if (buf != mark) {
                            buf = Fantasy_Character_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "r" */
                        return unmatched;
                    } /* "r" */
                } else { /* descend "Characte" */
                    return unmatched;
                } /* descend "Characte" */
            } else { /* branch "Reordere" */
                if (w == 0x52656f7264657265) { /* descend "Reordere" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffffff000000) == 0x64456e756d000000) { /* "dEnum" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                        if (buf != mark) {
                            buf = Fantasy_ReorderedEnum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "dEnum" */
                        if ((w & 0xffffffffffff0000) == 0x64436f6c6f720000) { /* "dColor" */
                            buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 6);
                            if (buf != mark) {
                                buf = Fantasy_ReorderedColor_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                            } else {
                                return unmatched;
                            }
                        } else { /* "dColor" */
                            return unmatched;
                        } /* "dColor" */
                    } /* "dEnum" */
                } else { /* descend "Reordere" */
                    return unmatched;
                } /* descend "Reordere" */
            } /* branch "Reordere" */
        } else { /* descend "Fantasy." */
            return unmatched;
        } /* descend "Fantasy." */
    } else { /* branch "MyGame.E" */
        if (w == 0x4d7947616d652e45) { /* descend "MyGame.E" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w < 0x78616d706c652e69) { /* branch "xample.i" */
                if (w < 0x78616d706c652e43) { /* branch "xample.C" */
                    if (w == 0x78616d706c652e41) { /* descend "xample.A" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffff000000000000) == 0x6e79000000000000) { /* "ny" */
                            buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 2);
                            if (buf != mark) {
                                buf = MyGame_Example_Any_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                            } else {
                                return unmatched;
                            }
                        } else { /* "ny" */
                            return unmatched;
                        } /* "ny" */
                    } else { /* descend "xample.A" */
                        return unmatched;
                    } /* descend "xample.A" */
                } else { /* branch "xample.C" */
                    if (w < 0x78616d706c652e46) { /* branch "xample.F" */
                        if (w == 0x78616d706c652e43) { /* descend "xample.C" */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if ((w & 0xffffffff00000000) == 0x6f6c6f7200000000) { /* "olor" */
                                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                                if (buf != mark) {
                                    buf = MyGame_Example_Color_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                } else {
                                    return unmatched;
                                }
                            } else { /* "olor" */
                                return unmatched;
                            } /* "olor" */
                        } else { /* descend "xample.C" */
                            return unmatched;
                        } /* descend "xample.C" */
                    } else { /* branch "xample.F" */
                        if (w == 0x78616d706c652e46) { /* descend "xample.F" */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if ((w & 0xffff000000000000) == 0x6f6f000000000000) { /* "oo" */
                                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 2);
                                if (buf != mark) {
                                    buf = MyGame_Example_Foo_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                } else {
                                    return unmatched;
                                }
                            } else { /* "oo" */
                                return unmatched;
                            } /* "oo" */
                        } else { /* descend "xample.F" */
                            if (w == 0x78616d706c652e68) { /* descend "xample.h" */
                                buf += 8;
                                w = flatcc_json_parser_symbol_part(buf, end);
                                if ((w & 0xffffffffffffff00) == 0x65785f656e756d00) { /* "ex_enum" */
                                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                                    if (buf != mark) {
                                        buf = MyGame_Example_hex_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                    } else {
                                        return unmatched;
                                    }
                                } else { /* "ex_enum" */
                                    return unmatched;
                                } /* "ex_enum" */
                            } else { /* descend "xample.h" */
                                return unmatched;
                            } /* descend "xample.h" */
                        } /* descend "xample.F" */
                    } /* branch "xample.F" */
                } /* branch "xample.C" */
            } else { /* branch "xample.i" */
                if (w < 0x78616d706c652e6e) { /* branch "xample.n" */
                    if (w == 0x78616d706c652e69) { /* descend "xample.i" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffffffffffff00) == 0x6e745f656e756d00) { /* "nt_enum" */
                            buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                            if (buf != mark) {
                                buf = MyGame_Example_int_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                            } else {
                                return unmatched;
                            }
                        } else { /* "nt_enum" */
                            return unmatched;
                        } /* "nt_enum" */
                    } else { /* descend "xample.i" */
                        return unmatched;
                    } /* descend "xample.i" */
                } else { /* branch "xample.n" */
                    if (w < 0x78616d706c65322e) { /* branch "xample2." */
                        if (w == 0x78616d706c652e6e) { /* descend "xample.n" */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if ((w & 0xffffffffffffff00) == 0x65675f656e756d00) { /* "eg_enum" */
                                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                                if (buf != mark) {
                                    buf = MyGame_Example_neg_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                } else {
                                    goto pfguard1;
                                }
                            } else { /* "eg_enum" */
                                goto pfguard1;
                            } /* "eg_enum" */
                            goto endpfguard1;
pfguard1:
                            if (w == 0x6f74656d70747965) { /* descend "otemptye" */
                                buf += 8;
                                w = flatcc_json_parser_symbol_part(buf, end);
                                if ((w & 0xffffff0000000000) == 0x6e756d0000000000) { /* "num" */
                                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                                    if (buf != mark) {
                                        buf = MyGame_Example_notemptyenum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                    } else {
                                        return unmatched;
                                    }
                                } else { /* "num" */
                                    return unmatched;
                                } /* "num" */
                            } else { /* descend "otemptye" */
                                return unmatched;
                            } /* descend "otemptye" */
endpfguard1:
                            (void)0;
                        } else { /* descend "xample.n" */
                            return unmatched;
                        } /* descend "xample.n" */
                    } else { /* branch "xample2." */
                        if (w == 0x78616d706c65322e) { /* descend "xample2." */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if (w == 0x5375625379737465) { /* descend "SubSyste" */
                                buf += 8;
                                w = flatcc_json_parser_symbol_part(buf, end);
                                if (w == 0x6d2e537562537973) { /* descend "m.SubSys" */
                                    buf += 8;
                                    w = flatcc_json_parser_symbol_part(buf, end);
                                    if ((w & 0xffffffff00000000) == 0x74656d4200000000) { /* "temB" */
                                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                                        if (buf != mark) {
                                            buf = MyGame_Example2_SubSystem_SubSystemB_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                        } else {
                                            return unmatched;
                                        }
                                    } else { /* "temB" */
                                        if ((w & 0xffffffff00000000) == 0x74656d4100000000) { /* "temA" */
                                            buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                                            if (buf != mark) {
                                                buf = MyGame_Example2_SubSystem_SubSystemA_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                            } else {
                                                return unmatched;
                                            }
                                        } else { /* "temA" */
                                            return unmatched;
                                        } /* "temA" */
                                    } /* "temB" */
                                } else { /* descend "m.SubSys" */
                                    return unmatched;
                                } /* descend "m.SubSys" */
                            } else { /* descend "SubSyste" */
                                if ((w & 0xffffff0000000000) == 0x666f6f0000000000) { /* "foo" */
                                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                                    if (buf != mark) {
                                        buf = MyGame_Example2_foo_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                    } else {
                                        return unmatched;
                                    }
                                } else { /* "foo" */
                                    return unmatched;
                                } /* "foo" */
                            } /* descend "SubSyste" */
                        } else { /* descend "xample2." */
                            return unmatched;
                        } /* descend "xample2." */
                    } /* branch "xample2." */
                } /* branch "xample.n" */
            } /* branch "xample.i" */
        } else { /* descend "MyGame.E" */
            if (w == 0x4d7947616d652e4f) { /* descend "MyGame.O" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if (w == 0x746865724e616d65) { /* descend "therName" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if (w == 0x53706163652e4672) { /* descend "Space.Fr" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if (w == 0x6f6d496e636c7564) { /* descend "omInclud" */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if ((w & 0xff00000000000000) == 0x6500000000000000) { /* "e" */
                                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 1);
                                if (buf != mark) {
                                    buf = MyGame_OtherNameSpace_FromInclude_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                } else {
                                    return unmatched;
                                }
                            } else { /* "e" */
                                return unmatched;
                            } /* "e" */
                        } else { /* descend "omInclud" */
                            return unmatched;
                        } /* descend "omInclud" */
                    } else { /* descend "Space.Fr" */
                        return unmatched;
                    } /* descend "Space.Fr" */
                } else { /* descend "therName" */
                    return unmatched;
                } /* descend "therName" */
            } else { /* descend "MyGame.O" */
                return unmatched;
            } /* descend "MyGame.O" */
        } /* descend "MyGame.E" */
    } /* branch "MyGame.E" */
    return buf;
}